

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O0

void __thiscall OpenMD::LangevinPiston::genRandomForce(LangevinPiston *this,RealType *randomForce)

{
  RandNumGen *__urng;
  normal_distribution<double> *in_RSI;
  long in_RDI;
  result_type_conflict1 rVar1;
  
  __urng = (RandNumGen *)(in_RDI + 0x238);
  std::__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)in_RSI);
  rVar1 = std::normal_distribution<double>::operator()(in_RSI,__urng);
  (in_RSI->_M_param)._M_mean = rVar1;
  return;
}

Assistant:

void LangevinPiston::genRandomForce(RealType& randomForce) {
#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randomForce = forceDistribution_(*randNumGen_);
#ifdef IS_MPI
    }
    // push this out to the other processors
    // Same command on all nodes:
    MPI_Bcast(&randomForce, 1, MPI_REALTYPE, 0, MPI_COMM_WORLD);
#endif

    return;
  }